

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateCommonBuilderMethods
          (MessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap *this_00;
  MessageGenerator *pMVar1;
  int iVar2;
  FieldGenerator *pFVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  Descriptor *pDVar5;
  Descriptor *in_RDX;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  FileDescriptor *extraout_RDX_01;
  FileDescriptor *extraout_RDX_02;
  Descriptor *descriptor_01;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *extraout_RDX_05;
  Descriptor *extraout_RDX_06;
  Descriptor *extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 uVar6;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  Descriptor *extraout_RDX_17;
  Descriptor *extraout_RDX_18;
  Descriptor *extraout_RDX_19;
  Descriptor *extraout_RDX_20;
  Descriptor *extraout_RDX_21;
  Descriptor *extraout_RDX_22;
  uint uVar7;
  long lVar8;
  uint uVar9;
  java *pjVar10;
  uint uVar11;
  int iVar12;
  Printer *this_01;
  int iVar13;
  long lVar14;
  char *text;
  string local_88;
  undefined8 local_68;
  Printer *local_60;
  MessageGenerator *local_58;
  string local_50;
  
  ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&local_88);
  pDVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pDVar5 = extraout_RDX_00;
  }
  text = "private void maybeForceBuilderInitialization() {\n}\n";
  if (*(int *)(*(long *)(*(long *)((java *)this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,pDVar5);
    io::Printer::Print(printer,
                       "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                       ,"classname",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n"
                        );
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      pDVar5 = this->descriptor_;
      if (0 < *(int *)(pDVar5 + 0x2c)) {
        lVar8 = 0;
        lVar14 = 0;
        do {
          pFVar3 = FieldGeneratorMap::get
                             (&this->field_generators_,
                              (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar8));
          (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
          lVar14 = lVar14 + 1;
          pDVar5 = this->descriptor_;
          lVar8 = lVar8 + 0x78;
        } while (lVar14 < *(int *)(pDVar5 + 0x2c));
      }
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
      text = "  }\n}\n";
    }
  }
  io::Printer::Print(printer,text);
  ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,descriptor);
  io::Printer::Print(printer,
                     "private static Builder create() {\n  return new Builder();\n}\n\npublic Builder clear() {\n  super.clear();\n"
                     ,"classname",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  pDVar5 = this->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar8 = 0;
    lVar14 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar8));
      (*pFVar3->_vptr_FieldGenerator[8])(pFVar3,printer);
      lVar14 = lVar14 + 1;
      pDVar5 = this->descriptor_;
      lVar8 = lVar8 + 0x78;
    } while (lVar14 < *(int *)(pDVar5 + 0x2c));
  }
  io::Printer::Outdent(printer);
  ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,descriptor_00);
  io::Printer::Print(printer,
                     "  return this;\n}\n\npublic Builder clone() {\n  return create().mergeFrom(buildPartial());\n}\n\n"
                     ,"classname",&local_88);
  pDVar5 = (Descriptor *)extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pDVar5 = (Descriptor *)extraout_RDX_02;
  }
  pjVar10 = (java *)this->descriptor_;
  if (*(int *)(*(long *)(*(java **)(pjVar10 + 0x10) + 0x88) + 0x50) != 3) {
    ClassName_abi_cxx11_(&local_88,*(java **)(pjVar10 + 0x10),(FileDescriptor *)pDVar5);
    (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
              (&local_50,*(_anonymous_namespace_ **)(this->descriptor_ + 8),descriptor_01);
    io::Printer::Print(printer,
                       "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",&local_88,"identifier",&local_50);
    pDVar5 = extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      pDVar5 = extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      pDVar5 = extraout_RDX_05;
    }
    pjVar10 = (java *)this->descriptor_;
  }
  ClassName_abi_cxx11_(&local_88,pjVar10,pDVar5);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&local_88);
  pDVar5 = extraout_RDX_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pDVar5 = extraout_RDX_07;
  }
  ClassName_abi_cxx11_(&local_88,(java *)this->descriptor_,pDVar5);
  io::Printer::Print(printer,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  pDVar5 = this->descriptor_;
  local_58 = this;
  if (*(int *)(pDVar5 + 0x2c) < 1) {
    local_68 = (FieldGeneratorMap *)((ulong)local_68._4_4_ << 0x20);
    uVar11 = 0;
    uVar6 = extraout_RDX_08;
    this_01 = printer;
  }
  else {
    local_68 = &this->field_generators_;
    lVar14 = 0;
    lVar8 = 0;
    iVar12 = 0;
    iVar13 = 0;
    local_60 = printer;
    do {
      pFVar3 = FieldGeneratorMap::get
                         (local_68,(FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar14));
      iVar2 = (*pFVar3->_vptr_FieldGenerator[3])(pFVar3);
      iVar13 = iVar13 + iVar2;
      iVar2 = (*pFVar3->_vptr_FieldGenerator[2])(pFVar3);
      iVar12 = iVar12 + iVar2;
      lVar8 = lVar8 + 1;
      pDVar5 = this->descriptor_;
      lVar14 = lVar14 + 0x78;
    } while (lVar8 < *(int *)(pDVar5 + 0x2c));
    uVar9 = iVar12 + 0x1f;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar9;
    uVar11 = iVar12 + 0x3e;
    if (-1 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar6 = extraout_RDX_09;
    if (0 < iVar13) {
      pjVar10 = (java *)0x0;
      do {
        GetBitFieldName_abi_cxx11_(&local_88,pjVar10,(int)uVar6);
        io::Printer::Print(local_60,"int from_$bit_field_name$ = $bit_field_name$;\n",
                           "bit_field_name",&local_88);
        paVar4 = &local_88.field_2;
        uVar6 = extraout_RDX_10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar4) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          paVar4 = extraout_RAX;
          uVar6 = extraout_RDX_11;
        }
        uVar9 = (int)pjVar10 + 1;
        pjVar10 = (java *)(ulong)uVar9;
      } while (iVar13 + 0x1fU >> 5 != uVar9);
    }
    uVar11 = (int)uVar11 >> 5;
    uVar9 = 0;
    if (iVar12 < 1) {
      local_68 = (FieldGeneratorMap *)((ulong)local_68._4_4_ << 0x20);
      this_01 = local_60;
    }
    else {
      local_68 = (FieldGeneratorMap *)
                 CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)paVar4 >> 8),0 < iVar12));
      uVar7 = 1;
      if (1 < (int)uVar11) {
        uVar7 = uVar11;
      }
      do {
        GetBitFieldName_abi_cxx11_(&local_88,(java *)(ulong)uVar9,(int)uVar6);
        io::Printer::Print(local_60,"int to_$bit_field_name$ = 0;\n","bit_field_name",&local_88);
        uVar6 = extraout_RDX_12;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          uVar6 = extraout_RDX_13;
        }
        uVar9 = uVar9 + 1;
        this_01 = local_60;
      } while (uVar7 != uVar9);
    }
  }
  pMVar1 = local_58;
  pDVar5 = local_58->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    this_00 = &local_58->field_generators_;
    lVar8 = 0;
    lVar14 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar8))
      ;
      (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,this_01);
      lVar14 = lVar14 + 1;
      pDVar5 = pMVar1->descriptor_;
      lVar8 = lVar8 + 0x78;
      uVar6 = extraout_RDX_14;
    } while (lVar14 < *(int *)(pDVar5 + 0x2c));
  }
  if ((char)local_68 != '\0') {
    uVar9 = 1;
    if (1 < (int)uVar11) {
      uVar9 = uVar11;
    }
    uVar11 = 0;
    do {
      GetBitFieldName_abi_cxx11_(&local_88,(java *)(ulong)uVar11,(int)uVar6);
      io::Printer::Print(this_01,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name"
                         ,&local_88);
      uVar6 = extraout_RDX_15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_16;
      }
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  io::Printer::Outdent(this_01);
  pMVar1 = local_58;
  pjVar10 = (java *)local_58->descriptor_;
  pDVar5 = extraout_RDX_17;
  if (*(int *)(*(long *)(*(long *)(pjVar10 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(this_01,"  onBuilt();\n");
    pjVar10 = (java *)pMVar1->descriptor_;
    pDVar5 = extraout_RDX_18;
  }
  ClassName_abi_cxx11_(&local_88,pjVar10,pDVar5);
  io::Printer::Print(this_01,"  return result;\n}\n\n","classname",&local_88);
  pDVar5 = extraout_RDX_19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    pDVar5 = extraout_RDX_20;
  }
  pjVar10 = (java *)pMVar1->descriptor_;
  iVar12 = *(int *)(*(long *)(*(long *)(pjVar10 + 0x10) + 0x88) + 0x50);
  if (iVar12 != 2) {
    if (iVar12 != 3) {
      ClassName_abi_cxx11_(&local_88,pjVar10,pDVar5);
      io::Printer::Print(this_01,
                         "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                         ,"classname",&local_88);
      pDVar5 = extraout_RDX_21;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        pDVar5 = extraout_RDX_22;
      }
      pjVar10 = (java *)pMVar1->descriptor_;
    }
    ClassName_abi_cxx11_(&local_88,pjVar10,pDVar5);
    io::Printer::Print(this_01,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    io::Printer::Indent(this_01);
    pDVar5 = pMVar1->descriptor_;
    if (0 < *(int *)(pDVar5 + 0x2c)) {
      lVar8 = 0;
      lVar14 = 0;
      do {
        pFVar3 = FieldGeneratorMap::get
                           (&pMVar1->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar8));
        (*pFVar3->_vptr_FieldGenerator[9])(pFVar3,this_01);
        lVar14 = lVar14 + 1;
        pDVar5 = pMVar1->descriptor_;
        lVar8 = lVar8 + 0x78;
      } while (lVar14 < *(int *)(pDVar5 + 0x2c));
    }
    io::Printer::Outdent(this_01);
    pDVar5 = pMVar1->descriptor_;
    if (0 < *(int *)(pDVar5 + 0x58)) {
      io::Printer::Print(this_01,"  this.mergeExtensionFields(other);\n");
      pDVar5 = pMVar1->descriptor_;
    }
    if (*(int *)(*(long *)(*(long *)(pDVar5 + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(this_01,"  this.mergeUnknownFields(other.getUnknownFields());\n");
    }
    io::Printer::Print(this_01,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
    "// Construct using $classname$.newBuilder()\n"
    "private Builder() {\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n",
      "classname", ClassName(descriptor_));
  }


  if (HasNestedBuilders(descriptor_)) {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
      "  }\n"
      "}\n");
  } else {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "}\n");
  }

  printer->Print(
    "private static Builder create() {\n"
    "  return new Builder();\n"
    "}\n"
    "\n"
    "public Builder clear() {\n"
    "  super.clear();\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n"
    "public Builder clone() {\n"
    "  return create().mergeFrom(buildPartial());\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));
  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", ClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n"
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  // Local vars for from and to bit fields to avoid accessing the builder and
  // message over and over for these fields. Seems to provide a slight
  // perforamance improvement in micro benchmark and this is also what proto1
  // code does.
  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("int to_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  printer->Outdent();

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
    "  onBuilt();\n");
  }

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  if (HasGeneratedMethods(descriptor_)) {
    // MergeFrom(Message other) requires the ability to distinguish the other
    // messages type by its descriptor.
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", ClassName(descriptor_));
    }

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", ClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i)).GenerateMergingCode(printer);
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (HasUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.getUnknownFields());\n");
    }

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}